

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QString,_QVariant> * __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QString,_QVariant>_>::node
          (iterator<QHashPrivate::Node<QString,_QVariant>_> *this)

{
  Node<QString,_QVariant> *pNVar1;
  int __c;
  char *in_RSI;
  Span<QHashPrivate::Node<QString,_QVariant>_> *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  span((iterator<QHashPrivate::Node<QString,_QVariant>_> *)in_RDI);
  index((iterator<QHashPrivate::Node<QString,_QVariant>_> *)in_RDI,in_RSI,__c);
  pNVar1 = Span<QHashPrivate::Node<QString,_QVariant>_>::at(in_RDI,in_stack_ffffffffffffffd8);
  return pNVar1;
}

Assistant:

inline Node *node() const noexcept
    {
        Q_ASSERT(!isUnused());
        return &d->spans[span()].at(index());
    }